

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O3

double __thiscall AddrInfo::GetChance(AddrInfo *this,NodeSeconds now)

{
  double dVar1;
  int iVar2;
  long in_FS_OFFSET;
  double dVar3;
  
  iVar2 = 8;
  if (this->nAttempts < 8) {
    iVar2 = this->nAttempts;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    dVar1 = *(double *)
             (&DAT_00f95580 + (ulong)((long)now.__d.__r - (this->m_last_try).__d.__r < 600) * 8);
    dVar3 = pow(0.66,(double)iVar2);
    return dVar3 * dVar1;
  }
  __stack_chk_fail();
}

Assistant:

double AddrInfo::GetChance(NodeSeconds now) const
{
    double fChance = 1.0;

    // deprioritize very recent attempts away
    if (now - m_last_try < 10min) {
        fChance *= 0.01;
    }

    // deprioritize 66% after each failed attempt, but at most 1/28th to avoid the search taking forever or overly penalizing outages.
    fChance *= pow(0.66, std::min(nAttempts, 8));

    return fChance;
}